

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# perceptual_linear_predictive_coefficients_analysis.cc
# Opt level: O0

void __thiscall
sptk::PerceptualLinearPredictiveCoefficientsAnalysis::PerceptualLinearPredictiveCoefficientsAnalysis
          (PerceptualLinearPredictiveCoefficientsAnalysis *this,int fft_length,int num_channel,
          int num_order,int liftering_coefficient,double compression_factor,double sampling_rate,
          double lowest_frequency,double highest_frequency,double floor)

{
  undefined1 uVar1;
  undefined1 uVar2;
  undefined1 uVar3;
  undefined1 uVar4;
  bool bVar5;
  reference pvVar6;
  reference pvVar7;
  int in_ECX;
  int in_EDX;
  undefined4 in_ESI;
  undefined8 *in_RDI;
  undefined4 in_R8D;
  double in_XMM0_Qa;
  double dVar8;
  double dVar9;
  double in_XMM1_Qa;
  undefined8 in_XMM2_Qa;
  MelFilterBankAnalysis *unaff_retaddr;
  double theta;
  int m_1;
  double *w;
  double f2;
  double f1;
  int m;
  double *e;
  vector<double,_std::allocator<double>_> center_frequencies;
  undefined4 in_stack_ffffffffffffff10;
  undefined4 uVar10;
  undefined8 in_stack_ffffffffffffff18;
  int iVar11;
  MelFilterBankAnalysis *this_00;
  InverseFourierTransform *in_stack_ffffffffffffff20;
  vector<double,_std::allocator<double>_> *this_01;
  int local_9c;
  int local_7c;
  vector<double,_std::allocator<double>_> local_68 [2];
  
  iVar11 = (int)((ulong)in_stack_ffffffffffffff18 >> 0x20);
  *in_RDI = &PTR__PerceptualLinearPredictiveCoefficientsAnalysis_001395c0;
  *(undefined4 *)(in_RDI + 1) = in_R8D;
  in_RDI[2] = in_XMM0_Qa;
  MelFilterBankAnalysis::MelFilterBankAnalysis
            (unaff_retaddr,(int)((ulong)in_RDI >> 0x20),(int)in_RDI,(double)CONCAT44(in_ESI,in_EDX),
             (double)CONCAT44(in_ECX,in_R8D),in_XMM0_Qa,in_XMM1_Qa,
             SUB81((ulong)in_XMM2_Qa >> 0x38,0));
  GetNumChannel((PerceptualLinearPredictiveCoefficientsAnalysis *)0x10a765);
  InverseFourierTransform::InverseFourierTransform(in_stack_ffffffffffffff20,iVar11);
  LevinsonDurbinRecursion::LevinsonDurbinRecursion
            ((LevinsonDurbinRecursion *)(in_RDI + 0x13),in_ECX);
  LinearPredictiveCoefficientsToCepstrum::LinearPredictiveCoefficientsToCepstrum
            ((LinearPredictiveCoefficientsToCepstrum *)(in_RDI + 0x15),in_ECX,in_ECX);
  *(undefined1 *)(in_RDI + 0x18) = 1;
  this_00 = (MelFilterBankAnalysis *)(in_RDI + 0x19);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10a7de);
  this_01 = (vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c);
  std::vector<double,_std::allocator<double>_>::vector
            ((vector<double,_std::allocator<double>_> *)0x10a7f4);
  if ((((in_EDX <= in_ECX) || (*(int *)(in_RDI + 1) < 1)) || ((double)in_RDI[2] <= 0.0)) ||
     (((uVar1 = MelFilterBankAnalysis::IsValid((MelFilterBankAnalysis *)(in_RDI + 3)), !(bool)uVar1
       || (uVar2 = InverseFourierTransform::IsValid((InverseFourierTransform *)0x10a859),
          !(bool)uVar2)) ||
      ((uVar3 = LevinsonDurbinRecursion::IsValid((LevinsonDurbinRecursion *)(in_RDI + 0x13)),
       !(bool)uVar3 ||
       (uVar4 = LinearPredictiveCoefficientsToCepstrum::IsValid
                          ((LinearPredictiveCoefficientsToCepstrum *)(in_RDI + 0x15)), !(bool)uVar4)
       ))))) {
    *(undefined1 *)(in_RDI + 0x18) = 0;
  }
  else {
    std::vector<double,_std::allocator<double>_>::vector
              ((vector<double,_std::allocator<double>_> *)0x10a932);
    bVar5 = MelFilterBankAnalysis::GetCenterFrequencies
                      (this_00,(vector<double,_std::allocator<double>_> *)
                               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,
                                                  in_stack_ffffffffffffff10)))));
    uVar10 = CONCAT13(bVar5,(int3)in_stack_ffffffffffffff10);
    if (bVar5) {
      std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)this_00);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x19),0);
      for (local_7c = 0; local_7c < in_EDX; local_7c = local_7c + 1) {
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_68,(long)local_7c);
        dVar8 = *pvVar7;
        pvVar7 = std::vector<double,_std::allocator<double>_>::operator[](local_68,(long)local_7c);
        dVar8 = dVar8 * *pvVar7;
        dVar9 = dVar8 / (dVar8 + 160000.0);
        pvVar6[local_7c] = (dVar9 * dVar9 * (dVar8 + 1440000.0)) / (dVar8 + 9610000.0);
      }
      std::vector<double,_std::allocator<double>_>::resize(this_01,(size_type)this_00);
      pvVar6 = std::vector<double,_std::allocator<double>_>::operator[]
                         ((vector<double,_std::allocator<double>_> *)(in_RDI + 0x1c),0);
      for (local_9c = 0; local_9c < in_ECX; local_9c = local_9c + 1) {
        iVar11 = *(int *)(in_RDI + 1);
        dVar8 = sin(((double)(local_9c + 1) * 3.141592653589793) / (double)*(int *)(in_RDI + 1));
        pvVar6[local_9c] = (double)iVar11 * 0.5 * dVar8 + 1.0;
      }
    }
    else {
      *(undefined1 *)(in_RDI + 0x18) = 0;
    }
    std::vector<double,_std::allocator<double>_>::~vector
              ((vector<double,_std::allocator<double>_> *)
               CONCAT17(uVar1,CONCAT16(uVar2,CONCAT15(uVar3,CONCAT14(uVar4,uVar10)))));
  }
  return;
}

Assistant:

PerceptualLinearPredictiveCoefficientsAnalysis::
    PerceptualLinearPredictiveCoefficientsAnalysis(
        int fft_length, int num_channel, int num_order,
        int liftering_coefficient, double compression_factor,
        double sampling_rate, double lowest_frequency, double highest_frequency,
        double floor)
    : liftering_coefficient_(liftering_coefficient),
      compression_factor_(compression_factor),
      mel_filter_bank_analysis_(fft_length, num_channel, sampling_rate,
                                lowest_frequency, highest_frequency, floor,
                                true),
      inverse_fourier_transform_(2 * GetNumChannel() + 2),
      levinson_durbin_recursion_(num_order),
      linear_predictive_coefficients_to_cepstrum_(num_order, num_order),
      is_valid_(true) {
  if (num_channel <= num_order || liftering_coefficient_ <= 0 ||
      compression_factor_ <= 0.0 || !mel_filter_bank_analysis_.IsValid() ||
      !inverse_fourier_transform_.IsValid() ||
      !levinson_durbin_recursion_.IsValid() ||
      !linear_predictive_coefficients_to_cepstrum_.IsValid()) {
    is_valid_ = false;
    return;
  }

  std::vector<double> center_frequencies;
  if (!mel_filter_bank_analysis_.GetCenterFrequencies(&center_frequencies)) {
    is_valid_ = false;
    return;
  }

  equal_loudness_curve_.resize(num_channel);
  double* e(&(equal_loudness_curve_[0]));
  for (int m(0); m < num_channel; ++m) {
    const double f1(center_frequencies[m] * center_frequencies[m]);
    const double f2(f1 / (f1 + 1.6e5));
    e[m] = f2 * f2 * (f1 + 1.44e6) / (f1 + 9.61e6);
  }

  cepstal_weights_.resize(num_order);
  double* w(&(cepstal_weights_[0]));
  for (int m(0); m < num_order; ++m) {
    const double theta(sptk::kPi * (m + 1) / liftering_coefficient_);
    w[m] = 1.0 + 0.5 * liftering_coefficient_ * std::sin(theta);
  }
}